

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

void SubPointFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  reference this_03;
  reference this_04;
  type pVVar8;
  ulong uVar9;
  size_type __n;
  uint uVar10;
  UnifiedVectorFormat rhs_data;
  UnifiedVectorFormat lhs_data;
  ulong local_e8;
  ulong local_e0;
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pvVar6 = duckdb::vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pvVar7 = duckdb::vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  uVar3 = *(undefined8 *)(args + 0x18);
  vVar1 = *pvVar6;
  vVar2 = *pvVar7;
  duckdb::DataChunk::Flatten();
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  uVar10 = (uint)uVar3;
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar6,(UnifiedVectorFormat *)(long)(int)uVar10);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,(UnifiedVectorFormat *)(long)(int)uVar10);
  duckdb::Vector::SetVectorType((VectorType)result);
  this = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
          *)duckdb::StructVector::GetEntries(result);
  this_00 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             *)duckdb::StructVector::GetEntries(pvVar6);
  this_01 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             *)duckdb::StructVector::GetEntries(pvVar7);
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      local_e0 = uVar9;
      if (*local_78[0] != 0) {
        local_e0 = (ulong)*(uint *)(*local_78[0] + uVar9 * 4);
      }
      local_e8 = uVar9;
      if (*local_c0[0] != 0) {
        local_e8 = (ulong)*(uint *)(*local_c0[0] + uVar9 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + (local_e0 >> 6) * 8) >> (local_e0 & 0x3f) & 1) != 0)) &&
         ((local_b0 == 0 ||
          ((*(ulong *)(local_b0 + (local_e8 >> 6) * 8) >> (local_e8 & 0x3f) & 1) != 0)))) {
        if (*(long *)(this + 8) != *(long *)this) {
          __n = 0;
          do {
            this_02 = duckdb::
                      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this,__n);
            this_03 = duckdb::
                      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_00,__n);
            this_04 = duckdb::
                      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_01,__n);
            pVVar8 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(this_02);
            lVar4 = *(long *)(pVVar8 + 0x20);
            pVVar8 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(this_03);
            lVar5 = *(long *)(pVVar8 + 0x20);
            pVVar8 = duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator*(this_04);
            *(int *)(lVar4 + uVar9 * 4) =
                 *(int *)(lVar5 + local_e0 * 4) - *(int *)(*(long *)(pVVar8 + 0x20) + local_e8 * 4);
            __n = __n + 1;
          } while (__n < (ulong)(*(long *)(this + 8) - *(long *)this >> 3));
        }
      }
      else {
        duckdb::FlatVector::SetNull(result,uVar9,true);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar10 & 0x7fffffff));
  }
  if ((vVar1 == (value_type)0x2) && (vVar2 == (value_type)0x2)) {
    duckdb::Vector::SetVectorType((VectorType)result);
  }
  duckdb::Vector::Verify((ulong)result);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

inline void SubPointFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &left_vector = args.data[0];
	auto &right_vector = args.data[1];
	const int count = args.size();
	auto left_vector_type = left_vector.GetVectorType();
	auto right_vector_type = right_vector.GetVectorType();

	args.Flatten();
	UnifiedVectorFormat lhs_data;
	UnifiedVectorFormat rhs_data;
	left_vector.ToUnifiedFormat(count, lhs_data);
	right_vector.ToUnifiedFormat(count, rhs_data);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &child_entries = StructVector::GetEntries(result);
	auto &left_child_entries = StructVector::GetEntries(left_vector);
	auto &right_child_entries = StructVector::GetEntries(right_vector);
	for (int base_idx = 0; base_idx < count; base_idx++) {
		auto lhs_list_index = lhs_data.sel->get_index(base_idx);
		auto rhs_list_index = rhs_data.sel->get_index(base_idx);
		if (!lhs_data.validity.RowIsValid(lhs_list_index) || !rhs_data.validity.RowIsValid(rhs_list_index)) {
			FlatVector::SetNull(result, base_idx, true);
			continue;
		}
		for (size_t col = 0; col < child_entries.size(); ++col) {
			auto &child_entry = child_entries[col];
			auto &left_child_entry = left_child_entries[col];
			auto &right_child_entry = right_child_entries[col];
			auto pdata = ConstantVector::GetData<int32_t>(*child_entry);
			auto left_pdata = ConstantVector::GetData<int32_t>(*left_child_entry);
			auto right_pdata = ConstantVector::GetData<int32_t>(*right_child_entry);
			pdata[base_idx] = left_pdata[lhs_list_index] - right_pdata[rhs_list_index];
		}
	}
	if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}